

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

SrcList * sqlite3SrcListDup(sqlite3 *db,SrcList *p,int flags)

{
  long lVar1;
  u32 uVar2;
  uint uVar3;
  SrcList *pSVar4;
  char *pcVar5;
  ExprList *pEVar6;
  Select *pSVar7;
  Expr *pEVar8;
  IdList *pIVar9;
  long lVar10;
  long lVar11;
  
  if (p != (SrcList *)0x0) {
    uVar3 = 0x78;
    if (0 < p->nSrc) {
      uVar3 = p->nSrc * 0x70 | 8;
    }
    pSVar4 = (SrcList *)sqlite3DbMallocRawNN(db,(long)(int)uVar3);
    if (pSVar4 != (SrcList *)0x0) {
      uVar2 = p->nSrc;
      pSVar4->nAlloc = uVar2;
      pSVar4->nSrc = uVar2;
      lVar11 = 0x70;
      for (lVar10 = 0; lVar10 < (int)uVar2; lVar10 = lVar10 + 1) {
        *(undefined8 *)((long)(pSVar4->a + -1) + lVar11) =
             *(undefined8 *)((long)(p->a + -1) + lVar11);
        pcVar5 = sqlite3DbStrDup(db,*(char **)((long)p->a + lVar11 + -0x68));
        *(char **)((long)pSVar4->a + lVar11 + -0x68) = pcVar5;
        pcVar5 = sqlite3DbStrDup(db,*(char **)((long)p->a + lVar11 + -0x60));
        *(char **)((long)pSVar4->a + lVar11 + -0x60) = pcVar5;
        pcVar5 = sqlite3DbStrDup(db,*(char **)((long)p->a + lVar11 + -0x58));
        *(char **)((long)pSVar4->a + lVar11 + -0x58) = pcVar5;
        uVar3 = *(uint *)((long)p->a + lVar11 + -0x34);
        *(uint *)((long)pSVar4->a + lVar11 + -0x34) = uVar3;
        *(undefined4 *)((long)pSVar4->a + lVar11 + -0x30) =
             *(undefined4 *)((long)p->a + lVar11 + -0x30);
        *(undefined8 *)((long)pSVar4->a + lVar11 + -0x40) =
             *(undefined8 *)((long)p->a + lVar11 + -0x40);
        uVar3 = uVar3 >> 8;
        if ((uVar3 & 2) != 0) {
          pcVar5 = sqlite3DbStrDup(db,*(char **)((long)p->a + lVar11 + -0x10));
          *(char **)((long)pSVar4->a + lVar11 + -0x10) = pcVar5;
          uVar3 = (uint)*(byte *)((long)pSVar4->a + lVar11 + -0x33);
        }
        *(undefined8 *)((long)pSVar4->a + lVar11 + -8) = *(undefined8 *)((long)p->a + lVar11 + -8);
        if ((uVar3 & 4) != 0) {
          pEVar6 = sqlite3ExprListDup(db,*(ExprList **)((long)p->a + lVar11 + -0x10),flags);
          *(ExprList **)((long)pSVar4->a + lVar11 + -0x10) = pEVar6;
        }
        lVar1 = *(long *)((long)p->a + lVar11 + -0x50);
        *(long *)((long)pSVar4->a + lVar11 + -0x50) = lVar1;
        if (lVar1 != 0) {
          *(int *)(lVar1 + 0x3c) = *(int *)(lVar1 + 0x3c) + 1;
        }
        pSVar7 = sqlite3SelectDup(db,*(Select **)((long)p->a + lVar11 + -0x48),flags);
        *(Select **)((long)pSVar4->a + lVar11 + -0x48) = pSVar7;
        pEVar8 = sqlite3ExprDup(db,*(Expr **)((long)p->a + lVar11 + -0x28),flags);
        *(Expr **)((long)pSVar4->a + lVar11 + -0x28) = pEVar8;
        pIVar9 = sqlite3IdListDup(db,*(IdList **)((long)p->a + lVar11 + -0x20));
        *(IdList **)((long)pSVar4->a + lVar11 + -0x20) = pIVar9;
        *(undefined8 *)((long)pSVar4->a + lVar11 + -0x18) =
             *(undefined8 *)((long)p->a + lVar11 + -0x18);
        uVar2 = p->nSrc;
        lVar11 = lVar11 + 0x70;
      }
      return pSVar4;
    }
  }
  return (SrcList *)0x0;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListDup(sqlite3 *db, SrcList *p, int flags){
  SrcList *pNew;
  int i;
  int nByte;
  assert( db!=0 );
  if( p==0 ) return 0;
  nByte = sizeof(*p) + (p->nSrc>0 ? sizeof(p->a[0]) * (p->nSrc-1) : 0);
  pNew = sqlite3DbMallocRawNN(db, nByte );
  if( pNew==0 ) return 0;
  pNew->nSrc = pNew->nAlloc = p->nSrc;
  for(i=0; i<p->nSrc; i++){
    struct SrcList_item *pNewItem = &pNew->a[i];
    struct SrcList_item *pOldItem = &p->a[i];
    Table *pTab;
    pNewItem->pSchema = pOldItem->pSchema;
    pNewItem->zDatabase = sqlite3DbStrDup(db, pOldItem->zDatabase);
    pNewItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pNewItem->zAlias = sqlite3DbStrDup(db, pOldItem->zAlias);
    pNewItem->fg = pOldItem->fg;
    pNewItem->iCursor = pOldItem->iCursor;
    pNewItem->addrFillSub = pOldItem->addrFillSub;
    pNewItem->regReturn = pOldItem->regReturn;
    if( pNewItem->fg.isIndexedBy ){
      pNewItem->u1.zIndexedBy = sqlite3DbStrDup(db, pOldItem->u1.zIndexedBy);
    }
    pNewItem->pIBIndex = pOldItem->pIBIndex;
    if( pNewItem->fg.isTabFunc ){
      pNewItem->u1.pFuncArg = 
          sqlite3ExprListDup(db, pOldItem->u1.pFuncArg, flags);
    }
    pTab = pNewItem->pTab = pOldItem->pTab;
    if( pTab ){
      pTab->nTabRef++;
    }
    pNewItem->pSelect = sqlite3SelectDup(db, pOldItem->pSelect, flags);
    pNewItem->pOn = sqlite3ExprDup(db, pOldItem->pOn, flags);
    pNewItem->pUsing = sqlite3IdListDup(db, pOldItem->pUsing);
    pNewItem->colUsed = pOldItem->colUsed;
  }
  return pNew;
}